

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

bool __thiscall CECorrections::LoadNutation(CECorrections *this)

{
  bool bVar1;
  size_type sVar2;
  istream *piVar3;
  long in_RDI;
  exception *e;
  exception *e_2;
  exception *e_1;
  string line;
  double dpsi;
  double deps;
  double yp;
  double xp;
  double dut1;
  int mjd;
  ifstream corrections_file;
  string url;
  bool loaded;
  value_type *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  value_type *in_stack_fffffffffffffb48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb50;
  size_type in_stack_fffffffffffffb68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  CECorrections *in_stack_fffffffffffffbe8;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  int local_254;
  istream local_250 [543];
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = 1;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68));
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"http://maia.usno.navy.mil/ser7/finals2000A.all",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    LoadFile(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::__cxx11::string::string(local_2a0);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_250,local_2a0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_2a0);
      local_254 = std::__cxx11::stoi(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38,0
                                    );
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::substr((ulong)local_2e0,(ulong)local_2a0);
      local_260 = std::__cxx11::stod(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::substr((ulong)local_300,(ulong)local_2a0);
      local_268 = std::__cxx11::stod(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::substr((ulong)local_320,(ulong)local_2a0);
      local_270 = std::__cxx11::stod(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::substr((ulong)local_340,(ulong)local_2a0);
      local_278 = std::__cxx11::stod(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::substr((ulong)local_360,(ulong)local_2a0);
      local_280 = std::__cxx11::stod(in_stack_fffffffffffffb40,(size_t *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_360);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
                 (value_type_conflict2 *)in_stack_fffffffffffffb48);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb38);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb38);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb38);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb38);
    }
    std::ifstream::close();
    std::vector<int,_std::allocator<int>_>::shrink_to_fit
              ((vector<int,_std::allocator<int>_> *)0x12e2e6);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x12e2f9);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x12e30f);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x12e325);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x12e33b);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x12e351);
    std::__cxx11::string::~string(local_2a0);
    std::ifstream::~ifstream(local_250);
    std::__cxx11::string::~string(local_30);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool CECorrections::LoadNutation(void) const
{
    bool loaded = true;
    if (nutation_mjd_.size() == 0) {
        // Check if the file has been stored
        std::string   url = "http://maia.usno.navy.mil/ser7/finals2000A.all";
        std::ifstream corrections_file = LoadFile(nutation_file_, url);

        // Try to load values from the file
        try {
            // Allocate an approximate amount of memory for the values
            nutation_mjd_.reserve(20000);
            nutation_dut1_.reserve(20000);
            nutation_xp_.reserve(20000);
            nutation_yp_.reserve(20000);
            nutation_deps_.reserve(20000);
            nutation_dpsi_.reserve(20000);

            // Preliminary storage values
            int    mjd;
            double dut1;
            double xp;
            double yp;
            double deps;
            double dpsi;

            // Loop through each line of the file
            std::string line;
            while(std::getline(corrections_file, line)) {
                mjd = std::stoi(line.substr(7,8));

                // Try to load dut1, xypolar from bulletin B positions
                try {
                    dut1 = std::stod(line.substr(154,11));
                    xp   = std::stod(line.substr(134,10));
                    yp   = std::stod(line.substr(144,10));
                    deps = std::stod(line.substr(175,10));
                    dpsi = std::stod(line.substr(165,10));
                } 
                // Otherwise load from bulletin A positions
                catch (std::exception& e) {
                    try {
                        dut1 = std::stod(line.substr(58,10));
                        xp   = std::stod(line.substr(18, 9));
                        yp   = std::stod(line.substr(37, 9));
                        deps = std::stod(line.substr(116,9));
                        dpsi = std::stod(line.substr(97,9));
                    }
                    catch (std::exception& e) {
                        // Reached end of useable fields in the file
                        break;
                    }
                }

                // The Standards of Fundamental Astronomy expects angles in 
                // units of radians, so xp, yp, deps, and dpsi need to be converted
                nutation_mjd_.push_back( mjd );
                nutation_dut1_.push_back( dut1 );
                nutation_xp_.push_back( xp * DAS2R );      // arcsec -> radians
                nutation_yp_.push_back( yp * DAS2R );      // arcsec -> radians
                nutation_deps_.push_back( deps * DMAS2R ); // marcsec -> radians
                nutation_dpsi_.push_back( dpsi * DMAS2R ); // marcsec -> radians
            }

            // Close the corrections file
            corrections_file.close();

            // Shrink up the vectors so we dont take more memory than necessary
            nutation_mjd_.shrink_to_fit();
            nutation_dut1_.shrink_to_fit();
            nutation_xp_.shrink_to_fit();
            nutation_yp_.shrink_to_fit();
            nutation_deps_.shrink_to_fit();
            nutation_dpsi_.shrink_to_fit();

        } catch (std::exception& e) {
            std::cerr << "ERROR Unable to load corrections from file" << std::endl;
            std::cerr << e.what() << std::endl;
            loaded = false;
        }
    }
    return loaded;
}